

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

MatcherDescriberInterface *
testing::internal::MatcherBase<std::chrono::duration<long,std::ratio<1l,1000l>>const&>::
GetDescriberImpl<testing::internal::MatcherBase<std::chrono::duration<long,std::ratio<1l,1000l>>const&>::ValuePolicy<testing::internal::EqMatcher<std::chrono::duration<long,std::ratio<1l,1000l>>>,true>>
          (MatcherBase<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&> *m)

{
  return &m->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }